

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O1

void aom_get_var_sse_sum_8x8_quad_sse2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint32_t *sse8x8,
               int *sum8x8,uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  int k;
  long lVar27;
  int iVar28;
  ulong *puVar29;
  ulong *puVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  undefined1 auVar43 [16];
  
  lVar27 = 0;
  do {
    iVar39 = 0;
    iVar40 = 0;
    iVar41 = 0;
    iVar42 = 0;
    iVar28 = 8;
    sVar31 = 0;
    sVar32 = 0;
    sVar33 = 0;
    sVar34 = 0;
    sVar35 = 0;
    sVar36 = 0;
    sVar37 = 0;
    sVar38 = 0;
    puVar29 = (ulong *)ref_ptr;
    puVar30 = (ulong *)src_ptr;
    do {
      uVar1 = *puVar30;
      auVar3._8_6_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3[0xe] = (char)(uVar1 >> 0x38);
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar1;
      auVar5[0xc] = (char)(uVar1 >> 0x30);
      auVar5._13_2_ = auVar3._13_2_;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar1;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9._8_2_ = 0;
      auVar9._0_8_ = uVar1;
      auVar9[10] = (char)(uVar1 >> 0x28);
      auVar9._11_4_ = auVar7._11_4_;
      auVar11._8_2_ = 0;
      auVar11._0_8_ = uVar1;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = (char)(uVar1 >> 0x20);
      auVar13._0_8_ = uVar1;
      auVar13._9_6_ = auVar11._9_6_;
      auVar17._7_8_ = 0;
      auVar17._0_7_ = auVar13._8_7_;
      Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),(char)(uVar1 >> 0x18));
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var18;
      auVar19._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar19[0] = (char)(uVar1 >> 0x10);
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar19;
      auVar15[2] = (char)(uVar1 >> 8);
      auVar15._0_2_ = (ushort)uVar1;
      auVar15._3_12_ = SUB1512(auVar24 << 0x20,3);
      uVar2 = *puVar29;
      auVar4._8_6_ = 0;
      auVar4._0_8_ = uVar2;
      auVar4[0xe] = (char)(uVar2 >> 0x38);
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar2;
      auVar6[0xc] = (char)(uVar2 >> 0x30);
      auVar6._13_2_ = auVar4._13_2_;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar2;
      auVar8._12_3_ = auVar6._12_3_;
      auVar10._8_2_ = 0;
      auVar10._0_8_ = uVar2;
      auVar10[10] = (char)(uVar2 >> 0x28);
      auVar10._11_4_ = auVar8._11_4_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar2;
      auVar12._10_5_ = auVar10._10_5_;
      auVar14[8] = (char)(uVar2 >> 0x20);
      auVar14._0_8_ = uVar2;
      auVar14._9_6_ = auVar12._9_6_;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = auVar14._8_7_;
      Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var21;
      auVar22._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar22[0] = (char)(uVar2 >> 0x10);
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar22;
      auVar16[2] = (char)(uVar2 >> 8);
      auVar16._0_2_ = (ushort)uVar2;
      auVar16._3_12_ = SUB1512(auVar26 << 0x20,3);
      auVar43._0_2_ = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
      auVar43._2_2_ = auVar15._2_2_ - auVar16._2_2_;
      auVar43._4_2_ = auVar19._0_2_ - auVar22._0_2_;
      auVar43._6_2_ = (short)Var18 - (short)Var21;
      auVar43._8_2_ = auVar13._8_2_ - auVar14._8_2_;
      auVar43._10_2_ = auVar9._10_2_ - auVar10._10_2_;
      auVar43._12_2_ = auVar5._12_2_ - auVar6._12_2_;
      auVar43._14_2_ = (auVar3._13_2_ >> 8) - (auVar4._13_2_ >> 8);
      sVar31 = sVar31 + auVar43._0_2_;
      sVar32 = sVar32 + auVar43._2_2_;
      sVar33 = sVar33 + auVar43._4_2_;
      sVar34 = sVar34 + auVar43._6_2_;
      sVar35 = sVar35 + auVar43._8_2_;
      sVar36 = sVar36 + auVar43._10_2_;
      sVar37 = sVar37 + auVar43._12_2_;
      sVar38 = sVar38 + auVar43._14_2_;
      auVar43 = pmaddwd(auVar43,auVar43);
      iVar39 = iVar39 + auVar43._0_4_;
      iVar40 = iVar40 + auVar43._4_4_;
      iVar41 = iVar41 + auVar43._8_4_;
      iVar42 = iVar42 + auVar43._12_4_;
      puVar30 = (ulong *)((long)puVar30 + (long)src_stride);
      puVar29 = (ulong *)((long)puVar29 + (long)ref_stride);
      iVar28 = iVar28 + -1;
    } while (iVar28 != 0);
    sse8x8[lVar27] = iVar42 + iVar40 + iVar41 + iVar39;
    sum8x8[lVar27] =
         (int)(short)(sVar38 + sVar34 + sVar36 + sVar32 + sVar37 + sVar33 + sVar35 + sVar31);
    lVar27 = lVar27 + 1;
    src_ptr = (uint8_t *)((long)src_ptr + 8);
    ref_ptr = (uint8_t *)((long)ref_ptr + 8);
  } while (lVar27 != 4);
  *tot_sse = *tot_sse + sse8x8[3] + sse8x8[1] + sse8x8[2] + *sse8x8;
  *tot_sum = *tot_sum + sum8x8[3] + sum8x8[1] + sum8x8[2] + *sum8x8;
  lVar27 = 0;
  do {
    var8x8[lVar27] =
         sse8x8[lVar27] - (int)((ulong)((long)sum8x8[lVar27] * (long)sum8x8[lVar27]) >> 6);
    lVar27 = lVar27 + 1;
  } while (lVar27 != 4);
  return;
}

Assistant:

void aom_get_var_sse_sum_8x8_quad_sse2(const uint8_t *src_ptr, int src_stride,
                                       const uint8_t *ref_ptr, int ref_stride,
                                       uint32_t *sse8x8, int *sum8x8,
                                       unsigned int *tot_sse, int *tot_sum,
                                       uint32_t *var8x8) {
  // Loop over 4 8x8 blocks. Process one 8x32 block.
  for (int k = 0; k < 4; k++) {
    const uint8_t *src = src_ptr;
    const uint8_t *ref = ref_ptr;
    __m128i vsum = _mm_setzero_si128();
    __m128i vsse = _mm_setzero_si128();
    for (int i = 0; i < 8; i++) {
      const __m128i s = load8_8to16_sse2(src + (k * 8));
      const __m128i r = load8_8to16_sse2(ref + (k * 8));
      const __m128i diff = _mm_sub_epi16(s, r);
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff, diff));
      vsum = _mm_add_epi16(vsum, diff);

      src += src_stride;
      ref += ref_stride;
    }
    variance_final_128_pel_sse2(vsse, vsum, &sse8x8[k], &sum8x8[k]);
  }

  // Calculate variance at 8x8 level and total sse, sum of 8x32 block.
  *tot_sse += sse8x8[0] + sse8x8[1] + sse8x8[2] + sse8x8[3];
  *tot_sum += sum8x8[0] + sum8x8[1] + sum8x8[2] + sum8x8[3];
  for (int i = 0; i < 4; i++)
    var8x8[i] = sse8x8[i] - (uint32_t)(((int64_t)sum8x8[i] * sum8x8[i]) >> 6);
}